

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

Option * __thiscall CLI::OptionBase<CLI::Option>::group(OptionBase<CLI::Option> *this,string *name)

{
  bool bVar1;
  IncorrectConstruction *this_00;
  string local_40;
  
  bVar1 = detail::valid_alias_name_string(name);
  if (bVar1) {
    ::std::__cxx11::string::_M_assign((string *)this);
    return (Option *)this;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Group names may not contain newlines or null characters","");
  IncorrectConstruction::IncorrectConstruction(this_00,&local_40);
  __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CRTP *group(const std::string &name) {
        if(!detail::valid_alias_name_string(name)) {
            throw IncorrectConstruction("Group names may not contain newlines or null characters");
        }
        group_ = name;
        return static_cast<CRTP *>(this);
    }